

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

size_t fts3MatchinfoSize(MatchInfo *pInfo,char cArg)

{
  size_t local_20;
  size_t nVal;
  char cArg_local;
  MatchInfo *pInfo_local;
  
  switch(cArg) {
  case 'a':
  case 'l':
  case 's':
    local_20 = (size_t)pInfo->nCol;
    break;
  case 'b':
    local_20 = (size_t)(pInfo->nPhrase * ((pInfo->nCol + 0x1f) / 0x20));
    break;
  case 'c':
  case 'n':
  case 'p':
    local_20 = 1;
    break;
  default:
    local_20 = (size_t)(pInfo->nCol * pInfo->nPhrase * 3);
    break;
  case 'y':
    local_20 = (size_t)(pInfo->nCol * pInfo->nPhrase);
  }
  return local_20;
}

Assistant:

static size_t fts3MatchinfoSize(MatchInfo *pInfo, char cArg){
  size_t nVal;                      /* Number of integers output by cArg */

  switch( cArg ){
    case FTS3_MATCHINFO_NDOC:
    case FTS3_MATCHINFO_NPHRASE: 
    case FTS3_MATCHINFO_NCOL: 
      nVal = 1;
      break;

    case FTS3_MATCHINFO_AVGLENGTH:
    case FTS3_MATCHINFO_LENGTH:
    case FTS3_MATCHINFO_LCS:
      nVal = pInfo->nCol;
      break;

    case FTS3_MATCHINFO_LHITS:
      nVal = pInfo->nCol * pInfo->nPhrase;
      break;

    case FTS3_MATCHINFO_LHITS_BM:
      nVal = pInfo->nPhrase * ((pInfo->nCol + 31) / 32);
      break;

    default:
      assert( cArg==FTS3_MATCHINFO_HITS );
      nVal = pInfo->nCol * pInfo->nPhrase * 3;
      break;
  }

  return nVal;
}